

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O2

type_conflict2
jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
          (unsigned_long value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  bool bVar1;
  assertion_error *this;
  ulong uVar2;
  ulong uVar3;
  char_type *pcVar4;
  allocator<char> local_149;
  string local_148;
  char_type buf [255];
  
  uVar3 = 0;
  do {
    uVar2 = uVar3;
    buf[uVar2] = (byte)(value % 10) | 0x30;
    uVar3 = uVar2 + 1;
    if (0xfd < uVar2) break;
    bVar1 = 9 < value;
    value = value / 10;
  } while (bVar1);
  if (uVar3 != 0xff) {
    for (pcVar4 = buf + uVar2; buf <= pcVar4; pcVar4 = pcVar4 + -1) {
      std::__cxx11::string::push_back((char)result);
    }
    return uVar3;
  }
  this = (assertion_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"assertion \'p != last\' failed at  <> :0",&local_149);
  assertion_error::assertion_error(this,&local_148);
  __cxa_throw(this,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }